

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitLogicalCount
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,LogicalCountExpr e)

{
  BasicStringRef<char> value;
  Kind kind;
  ExprBase this_00;
  CountExpr sep;
  size_t in_RDI;
  int unaff_retaddr;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_stack_00000008;
  ExprBase in_stack_00000010;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  BasicWriter<char> *this_01;
  int precedence;
  ExprBase in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  size_t sVar1;
  
  this_01 = *(BasicWriter<char> **)(in_RDI + 8);
  sVar1 = in_RDI;
  kind = internal::ExprBase::kind((ExprBase *)0x19ddbb);
  precedence = (int)(in_RDI >> 0x20);
  mp::expr::str(kind);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this_01,
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  value.size_ = sVar1;
  value.data_ = in_stack_ffffffffffffffe8;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)in_stack_ffffffffffffffe0.impl_,value);
  fmt::BasicWriter<char>::operator<<(this_01,in_stack_ffffffffffffffbf);
  this_00.impl_ =
       (Impl *)LogicalCountExpr::lhs
                         ((LogicalCountExpr *)
                          CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  Visit(in_stack_00000008,(NumericExpr)in_stack_00000010.impl_,unaff_retaddr);
  fmt::BasicWriter<char>::operator<<(this_01,in_stack_ffffffffffffffbf);
  sep = LogicalCountExpr::rhs
                  ((LogicalCountExpr *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                  );
  ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)this_00.impl_,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
              )in_stack_ffffffffffffffe0.impl_,
             (char *)sep.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.
                     impl_,precedence);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitLogicalCount(LogicalCountExpr e) {
  writer_ << str(e.kind()) << ' ';
  Visit(e.lhs());
  writer_ << ' ';
  WriteArgs(e.rhs());
}